

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

void __thiscall
PlanningUnitMADPDiscrete::DeInitializeJointActionHistories(PlanningUnitMADPDiscrete *this)

{
  long in_RDI;
  
  if (*(long **)(in_RDI + 0x248) != (long *)0x0) {
    (**(code **)(**(long **)(in_RDI + 0x248) + 8))();
  }
  std::vector<TreeNode<JointActionHistory>_*,_std::allocator<TreeNode<JointActionHistory>_*>_>::
  clear((vector<TreeNode<JointActionHistory>_*,_std::allocator<TreeNode<JointActionHistory>_*>_> *)
        0x9d390f);
  *(undefined8 *)(in_RDI + 0xe0) = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x9d392a);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::clear
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)0x9d393a);
  return;
}

Assistant:

void PlanningUnitMADPDiscrete::DeInitializeJointActionHistories()
{
    delete _m_jointActionHistoryTreeRoot;//should recursively delet
    _m_jointActionHistoryTreeVector.clear();
    _m_nrJointActionHistories=0;
    _m_nrJointActionHistoriesT.clear();
    _m_firstJAHIforT.clear();    
}